

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::populateDictionary
          (DictionaryCache *this,int32_t startPos,int32_t endPos,int32_t firstRuleStatus,
          int32_t otherRuleStatus)

{
  RuleBasedBreakIterator *pRVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  UText *ut;
  int64_t iVar6;
  LanguageBreakEngine *pLVar7;
  uint uVar8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  LanguageBreakEngine *lbe;
  UChar32 c;
  UText *text;
  int32_t foundBreakCount;
  UErrorCode status;
  int32_t current;
  uint uStack_24;
  uint16_t category;
  int32_t rangeEnd;
  int32_t rangeStart;
  int32_t otherRuleStatus_local;
  int32_t firstRuleStatus_local;
  int32_t endPos_local;
  int32_t startPos_local;
  DictionaryCache *this_local;
  
  if (1 < endPos - startPos) {
    rangeEnd = otherRuleStatus;
    rangeStart = firstRuleStatus;
    otherRuleStatus_local = endPos;
    firstRuleStatus_local = startPos;
    _endPos_local = this;
    reset(this);
    this->fFirstRuleStatusIndex = rangeStart;
    this->fOtherRuleStatusIndex = rangeEnd;
    uStack_24 = firstRuleStatus_local;
    current = otherRuleStatus_local;
    text._4_4_ = U_ZERO_ERROR;
    text._0_4_ = 0;
    pRVar1 = this->fBI;
    ut = &pRVar1->fText;
    utext_setNativeIndex_63(ut,(long)firstRuleStatus_local);
    lbe._4_4_ = utext_current32_63(ut);
    uVar8 = (int)lbe._4_4_ >> 5;
    if (lbe._4_4_ < 0xd800) {
      local_64 = (uint)this->fBI->fData->fTrie->index[(int)uVar8] * 4 + (lbe._4_4_ & 0x1f);
    }
    else {
      if (lbe._4_4_ < 0x10000) {
        iVar3 = 0;
        if ((int)lbe._4_4_ < 0xdc00) {
          iVar3 = 0x140;
        }
        local_68 = (uint)this->fBI->fData->fTrie->index[(int)(iVar3 + uVar8)] * 4 +
                   (lbe._4_4_ & 0x1f);
      }
      else {
        if (lbe._4_4_ < 0x110000) {
          if ((int)lbe._4_4_ < this->fBI->fData->fTrie->highStart) {
            local_70 = (uint)this->fBI->fData->fTrie->index
                             [(int)((uint)this->fBI->fData->fTrie->index
                                          [((int)lbe._4_4_ >> 0xb) + 0x820] + (uVar8 & 0x3f))] * 4 +
                       (lbe._4_4_ & 0x1f);
          }
          else {
            local_70 = this->fBI->fData->fTrie->highValueIndex;
          }
          local_6c = local_70;
        }
        else {
          local_6c = this->fBI->fData->fTrie->indexLength + 0x80;
        }
        local_68 = local_6c;
      }
      local_64 = local_68;
    }
    status._2_2_ = this->fBI->fData->fTrie->index[local_64];
    while (UVar2 = ::U_SUCCESS(text._4_4_), UVar2 != '\0') {
      while( true ) {
        if ((pRVar1->fText).nativeIndexingLimit < (pRVar1->fText).chunkOffset) {
          iVar6 = (*((pRVar1->fText).pFuncs)->mapOffsetToNative)(ut);
          local_78 = (int)iVar6;
        }
        else {
          local_78 = (int)(pRVar1->fText).chunkNativeStart + (pRVar1->fText).chunkOffset;
        }
        foundBreakCount = local_78;
        if (current <= local_78 || (status._2_2_ & 0x4000) != U_ZERO_ERROR >> 0x10) break;
        utext_next32_63(ut);
        lbe._4_4_ = utext_current32_63(ut);
        uVar8 = (int)lbe._4_4_ >> 5;
        if (lbe._4_4_ < 0xd800) {
          local_8c = (uint)this->fBI->fData->fTrie->index[(int)uVar8] * 4 + (lbe._4_4_ & 0x1f);
        }
        else {
          if (lbe._4_4_ < 0x10000) {
            iVar3 = 0;
            if ((int)lbe._4_4_ < 0xdc00) {
              iVar3 = 0x140;
            }
            local_90 = (uint)this->fBI->fData->fTrie->index[(int)(iVar3 + uVar8)] * 4 +
                       (lbe._4_4_ & 0x1f);
          }
          else {
            if (lbe._4_4_ < 0x110000) {
              if ((int)lbe._4_4_ < this->fBI->fData->fTrie->highStart) {
                local_98 = (uint)this->fBI->fData->fTrie->index
                                 [(int)((uint)this->fBI->fData->fTrie->index
                                              [((int)lbe._4_4_ >> 0xb) + 0x820] + (uVar8 & 0x3f))] *
                           4 + (lbe._4_4_ & 0x1f);
              }
              else {
                local_98 = this->fBI->fData->fTrie->highValueIndex;
              }
              local_94 = local_98;
            }
            else {
              local_94 = this->fBI->fData->fTrie->indexLength + 0x80;
            }
            local_90 = local_94;
          }
          local_8c = local_90;
        }
        status._2_2_ = this->fBI->fData->fTrie->index[local_8c];
      }
      if (current <= local_78) break;
      pLVar7 = getLanguageBreakEngine(this->fBI,lbe._4_4_);
      if (pLVar7 != (LanguageBreakEngine *)0x0) {
        iVar3 = (*pLVar7->_vptr_LanguageBreakEngine[3])
                          (pLVar7,ut,(ulong)uStack_24,(ulong)(uint)current,&this->fBreaks);
        text._0_4_ = iVar3 + (int)text;
      }
      lbe._4_4_ = utext_current32_63(ut);
      uVar8 = (int)lbe._4_4_ >> 5;
      if (lbe._4_4_ < 0xd800) {
        local_a4 = (uint)this->fBI->fData->fTrie->index[(int)uVar8] * 4 + (lbe._4_4_ & 0x1f);
      }
      else {
        if (lbe._4_4_ < 0x10000) {
          iVar3 = 0;
          if ((int)lbe._4_4_ < 0xdc00) {
            iVar3 = 0x140;
          }
          local_a8 = (uint)this->fBI->fData->fTrie->index[(int)(iVar3 + uVar8)] * 4 +
                     (lbe._4_4_ & 0x1f);
        }
        else {
          if (lbe._4_4_ < 0x110000) {
            if ((int)lbe._4_4_ < this->fBI->fData->fTrie->highStart) {
              local_b0 = (uint)this->fBI->fData->fTrie->index
                               [(int)((uint)this->fBI->fData->fTrie->index
                                            [((int)lbe._4_4_ >> 0xb) + 0x820] + (uVar8 & 0x3f))] * 4
                         + (lbe._4_4_ & 0x1f);
            }
            else {
              local_b0 = this->fBI->fData->fTrie->highValueIndex;
            }
            local_ac = local_b0;
          }
          else {
            local_ac = this->fBI->fData->fTrie->indexLength + 0x80;
          }
          local_a8 = local_ac;
        }
        local_a4 = local_a8;
      }
      status._2_2_ = this->fBI->fData->fTrie->index[local_a4];
    }
    iVar5 = firstRuleStatus_local;
    if (0 < (int)text) {
      iVar4 = UVector32::elementAti(&this->fBreaks,0);
      if (iVar5 < iVar4) {
        UVector32::insertElementAt
                  (&this->fBreaks,firstRuleStatus_local,0,(UErrorCode *)((long)&text + 4));
      }
      iVar5 = otherRuleStatus_local;
      iVar4 = UVector32::peeki(&this->fBreaks);
      if (iVar4 < iVar5) {
        UVector32::push(&this->fBreaks,otherRuleStatus_local,(UErrorCode *)((long)&text + 4));
      }
      this->fPositionInCache = 0;
      iVar5 = UVector32::elementAti(&this->fBreaks,0);
      this->fStart = iVar5;
      iVar5 = UVector32::peeki(&this->fBreaks);
      this->fLimit = iVar5;
    }
  }
  return;
}

Assistant:

void RuleBasedBreakIterator::DictionaryCache::populateDictionary(int32_t startPos, int32_t endPos,
                                       int32_t firstRuleStatus, int32_t otherRuleStatus) {
    if ((endPos - startPos) <= 1) {
        return;
    }

    reset();
    fFirstRuleStatusIndex = firstRuleStatus;
    fOtherRuleStatusIndex = otherRuleStatus;

    int32_t rangeStart = startPos;
    int32_t rangeEnd = endPos;

    uint16_t    category;
    int32_t     current;
    UErrorCode  status = U_ZERO_ERROR;
    int32_t     foundBreakCount = 0;
    UText      *text = &fBI->fText;

    // Loop through the text, looking for ranges of dictionary characters.
    // For each span, find the appropriate break engine, and ask it to find
    // any breaks within the span.

    utext_setNativeIndex(text, rangeStart);
    UChar32     c = utext_current32(text);
    category = UTRIE2_GET16(fBI->fData->fTrie, c);

    while(U_SUCCESS(status)) {
        while((current = (int32_t)UTEXT_GETNATIVEINDEX(text)) < rangeEnd && (category & 0x4000) == 0) {
            utext_next32(text);           // TODO: cleaner loop structure.
            c = utext_current32(text);
            category = UTRIE2_GET16(fBI->fData->fTrie, c);
        }
        if (current >= rangeEnd) {
            break;
        }

        // We now have a dictionary character. Get the appropriate language object
        // to deal with it.
        const LanguageBreakEngine *lbe = fBI->getLanguageBreakEngine(c);

        // Ask the language object if there are any breaks. It will add them to the cache and
        // leave the text pointer on the other side of its range, ready to search for the next one.
        if (lbe != NULL) {
            foundBreakCount += lbe->findBreaks(text, rangeStart, rangeEnd, fBreaks);
        }

        // Reload the loop variables for the next go-round
        c = utext_current32(text);
        category = UTRIE2_GET16(fBI->fData->fTrie, c);
    }

    // If we found breaks, ensure that the first and last entries are
    // the original starting and ending position. And initialize the
    // cache iteration position to the first entry.

    // printf("foundBreakCount = %d\n", foundBreakCount);
    if (foundBreakCount > 0) {
        U_ASSERT(foundBreakCount == fBreaks.size());
        if (startPos < fBreaks.elementAti(0)) {
            // The dictionary did not place a boundary at the start of the segment of text.
            // Add one now. This should not commonly happen, but it would be easy for interactions
            // of the rules for dictionary segments and the break engine implementations to
            // inadvertently cause it. Cover it here, just in case.
            fBreaks.insertElementAt(startPos, 0, status);
        }
        if (endPos > fBreaks.peeki()) {
            fBreaks.push(endPos, status);
        }
        fPositionInCache = 0;
        // Note: Dictionary matching may extend beyond the original limit.
        fStart = fBreaks.elementAti(0);
        fLimit = fBreaks.peeki();
    } else {
        // there were no language-based breaks, even though the segment contained
        // dictionary characters. Subsequent attempts to fetch boundaries from the dictionary cache
        // for this range will fail, and the calling code will fall back to the rule based boundaries.
    }
}